

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_W
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TOperationType TVar2;
  bool saveInTable_local;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    TVar2 = OT_MatchRight_W;
    if (saveInTable) {
      TVar2 = OT_MatchRightSaveToTable_W;
    }
    addNoArgumensOperation(this,TVar2);
  }
  else {
    TVar2 = OT_MatchRightWithQualifier_W;
    if (saveInTable) {
      TVar2 = OT_MatchRightWithQualifierSaveToTable_W;
    }
    addQualifierIndexOperation(this,TVar2,qualifier);
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_W( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchRightSaveToTable_W : OT_MatchRight_W ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchRightWithQualifierSaveToTable_W :
			 OT_MatchRightWithQualifier_W ), qualifier );
	}
}